

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::Map(Map *this,Map *toCopy)

{
  string *psVar1;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *pvVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->pMapTitle = psVar1;
  pvVar2 = (vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pMapContinents = pvVar2;
  pvVar3 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pMapCountries = pvVar3;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::operator=
            (this->pMapContinents,toCopy->pMapContinents);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::operator=
            (this->pMapCountries,toCopy->pMapCountries);
  return;
}

Assistant:

Map::Map(const Map& toCopy) {
    pMapTitle = new string();
    pMapContinents = new vector<Continent*>;
    pMapCountries = new vector<Country*>;
    *pMapTitle = *toCopy.pMapTitle;
    *pMapContinents = *toCopy.pMapContinents;
    *pMapCountries = *toCopy.pMapCountries;
}